

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void __thiscall
TPZFrontNonSym<std::complex<long_double>_>::Expand
          (TPZFrontNonSym<std::complex<long_double>_> *this,int larger)

{
  complex<long_double> *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  longdouble local_38;
  longdouble local_28;
  
  local_38 = (longdouble)0;
  local_28 = local_38;
  TPZVec<std::complex<long_double>_>::Resize
            (&(this->super_TPZFront<std::complex<long_double>_>).fData,
             (ulong)(uint)(larger * larger),(complex<long_double> *)&local_38);
  lVar5 = (this->super_TPZFront<std::complex<long_double>_>).fFront;
  lVar6 = lVar5 << 5;
  lVar7 = (lVar5 + -1) * (long)larger * 0x20;
  while (lVar6 = lVar6 + -0x20, 0 < lVar5) {
    lVar5 = lVar5 + -1;
    lVar8 = (this->super_TPZFront<std::complex<long_double>_>).fFront;
    lVar9 = lVar8 << 5;
    for (; 0 < lVar8; lVar8 = lVar8 + -1) {
      pcVar1 = (this->super_TPZFront<std::complex<long_double>_>).fData.fStore;
      lVar10 = (this->super_TPZFront<std::complex<long_double>_>).fMaxFront * lVar6;
      uVar2 = *(undefined8 *)(pcVar1[-1]._M_value + lVar10 + lVar9);
      uVar3 = *(undefined8 *)((long)(pcVar1[-1]._M_value + lVar10 + lVar9) + 8);
      uVar4 = *(undefined8 *)((long)(pcVar1->_M_value + lVar9 + -0x10 + lVar10) + 8);
      *(undefined8 *)(pcVar1->_M_value + lVar9 + -0x10 + lVar7) =
           *(undefined8 *)(pcVar1->_M_value + lVar9 + -0x10 + lVar10);
      *(undefined8 *)((long)(pcVar1->_M_value + lVar9 + -0x10 + lVar7) + 8) = uVar4;
      *(undefined8 *)(pcVar1[-1]._M_value + lVar7 + lVar9) = uVar2;
      *(undefined8 *)((long)(pcVar1[-1]._M_value + lVar7 + lVar9) + 8) = uVar3;
      if (lVar5 != 0) {
        lVar10 = (this->super_TPZFront<std::complex<long_double>_>).fMaxFront * lVar6;
        pcVar1 = (this->super_TPZFront<std::complex<long_double>_>).fData.fStore;
        *(longdouble *)(pcVar1[-1]._M_value + lVar10 + lVar9) = (longdouble)0;
        *(longdouble *)(pcVar1->_M_value + lVar9 + -0x10 + lVar10) = (longdouble)0;
      }
      lVar9 = lVar9 + -0x20;
    }
    lVar7 = lVar7 + (long)larger * -0x20;
  }
  (this->super_TPZFront<std::complex<long_double>_>).fMaxFront = larger;
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::Expand(int larger) {
	//	PrintGlobal("Antes do Expande");
	this->fData.Resize(larger*larger,0.);
    int64_t i,j;
	for(j=this->fFront-1;j>=0;j--){
		for(i=this->fFront-1;i>=0;i--){
			this->fData[j*larger + i]=this->fData[j*this->fMaxFront + i];
			if(j) this->fData[j*this->fMaxFront+i] = 0.;
		}
	}
	this->fMaxFront = larger;
}